

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QGraphicsItemCache * __thiscall QGraphicsItemPrivate::extraItemCache(QGraphicsItemPrivate *this)

{
  QGraphicsItemCache *this_00;
  QGraphicsItemPrivate *that;
  long in_FS_OFFSET;
  QGraphicsItemCache *local_48;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  extra(&local_40,this,ExtraCacheData);
  this_00 = (QGraphicsItemCache *)qvariant_cast<void*>(&local_40);
  ::QVariant::~QVariant(&local_40);
  if (this_00 == (QGraphicsItemCache *)0x0) {
    this_00 = (QGraphicsItemCache *)operator_new(0x48);
    QGraphicsItemCache::QGraphicsItemCache(this_00);
    local_48 = this_00;
    ::QVariant::fromValue<void_*,_true>(&local_40,&local_48);
    setExtra(this,ExtraCacheData,&local_40);
    ::QVariant::~QVariant(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsItemCache *QGraphicsItemPrivate::extraItemCache() const
{
    QGraphicsItemCache *c = (QGraphicsItemCache *)qvariant_cast<void *>(extra(ExtraCacheData));
    if (!c) {
        QGraphicsItemPrivate *that = const_cast<QGraphicsItemPrivate *>(this);
        c = new QGraphicsItemCache;
        that->setExtra(ExtraCacheData, QVariant::fromValue<void *>(c));
    }
    return c;
}